

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
addOneWayReference(UA_Server *server,UA_Session *session,UA_Node *node,UA_AddReferencesItem *item)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_ReferenceNode *pUVar4;
  UA_StatusCode retval;
  UA_ReferenceNode *new_refs;
  size_t refssize;
  size_t i;
  UA_AddReferencesItem *item_local;
  UA_Node *node_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  sVar1 = node->referencesSize;
  pUVar4 = (UA_ReferenceNode *)realloc(node->references,(sVar1 + 1 | 3) * 0x50);
  if (pUVar4 == (UA_ReferenceNode *)0x0) {
    server_local._4_4_ = 0x80030000;
  }
  else {
    node->references = pUVar4;
    UA_ReferenceNode_init(pUVar4 + sVar1);
    UVar2 = UA_NodeId_copy(&item->referenceTypeId,&pUVar4[sVar1].referenceTypeId);
    UVar3 = UA_ExpandedNodeId_copy(&item->targetNodeId,&pUVar4[sVar1].targetId);
    server_local._4_4_ = UVar3 | UVar2;
    pUVar4[sVar1].isInverse = (UA_Boolean)((item->isForward ^ 0xffU) & 1);
    if (server_local._4_4_ == 0) {
      node->referencesSize = sVar1 + 1;
    }
    else {
      UA_ReferenceNode_deleteMembers(pUVar4 + sVar1);
    }
  }
  return server_local._4_4_;
}

Assistant:

static UA_StatusCode
addOneWayReference(UA_Server *server, UA_Session *session,
                   UA_Node *node, const UA_AddReferencesItem *item) {
    size_t i = node->referencesSize;
    size_t refssize = (i+1) | 3; // so the realloc is not necessary every time
    UA_ReferenceNode *new_refs = UA_realloc(node->references, sizeof(UA_ReferenceNode) * refssize);
    if(!new_refs)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    node->references = new_refs;
    UA_ReferenceNode_init(&new_refs[i]);
    UA_StatusCode retval = UA_NodeId_copy(&item->referenceTypeId, &new_refs[i].referenceTypeId);
    retval |= UA_ExpandedNodeId_copy(&item->targetNodeId, &new_refs[i].targetId);
    new_refs[i].isInverse = !item->isForward;
    if(retval == UA_STATUSCODE_GOOD)
        node->referencesSize = i+1;
    else
        UA_ReferenceNode_deleteMembers(&new_refs[i]);
    return retval;
}